

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Relooper.cpp
# Opt level: O0

SimpleShape * __thiscall CFG::Relooper::AddSimpleShape(Relooper *this)

{
  int iVar1;
  pointer pSVar2;
  unique_ptr<CFG::Shape,_std::default_delete<CFG::Shape>_> local_28;
  pointer local_20;
  SimpleShape *shapePtr;
  __single_object shape;
  Relooper *this_local;
  
  shape._M_t.super___uniq_ptr_impl<CFG::SimpleShape,_std::default_delete<CFG::SimpleShape>_>._M_t.
  super__Tuple_impl<0UL,_CFG::SimpleShape_*,_std::default_delete<CFG::SimpleShape>_>.
  super__Head_base<0UL,_CFG::SimpleShape_*,_false>._M_head_impl =
       (__uniq_ptr_data<CFG::SimpleShape,_std::default_delete<CFG::SimpleShape>,_true,_true>)
       (__uniq_ptr_data<CFG::SimpleShape,_std::default_delete<CFG::SimpleShape>,_true,_true>)this;
  std::make_unique<CFG::SimpleShape>();
  iVar1 = this->ShapeIdCounter;
  this->ShapeIdCounter = iVar1 + 1;
  pSVar2 = std::unique_ptr<CFG::SimpleShape,_std::default_delete<CFG::SimpleShape>_>::operator->
                     ((unique_ptr<CFG::SimpleShape,_std::default_delete<CFG::SimpleShape>_> *)
                      &shapePtr);
  (pSVar2->super_Shape).Id = iVar1;
  local_20 = std::unique_ptr<CFG::SimpleShape,_std::default_delete<CFG::SimpleShape>_>::get
                       ((unique_ptr<CFG::SimpleShape,_std::default_delete<CFG::SimpleShape>_> *)
                        &shapePtr);
  std::unique_ptr<CFG::Shape,std::default_delete<CFG::Shape>>::
  unique_ptr<CFG::SimpleShape,std::default_delete<CFG::SimpleShape>,void>
            ((unique_ptr<CFG::Shape,std::default_delete<CFG::Shape>> *)&local_28,
             (unique_ptr<CFG::SimpleShape,_std::default_delete<CFG::SimpleShape>_> *)&shapePtr);
  std::
  deque<std::unique_ptr<CFG::Shape,_std::default_delete<CFG::Shape>_>,_std::allocator<std::unique_ptr<CFG::Shape,_std::default_delete<CFG::Shape>_>_>_>
  ::push_back(&this->Shapes,(value_type *)&local_28);
  std::unique_ptr<CFG::Shape,_std::default_delete<CFG::Shape>_>::~unique_ptr(&local_28);
  pSVar2 = local_20;
  std::unique_ptr<CFG::SimpleShape,_std::default_delete<CFG::SimpleShape>_>::~unique_ptr
            ((unique_ptr<CFG::SimpleShape,_std::default_delete<CFG::SimpleShape>_> *)&shapePtr);
  return pSVar2;
}

Assistant:

SimpleShape* Relooper::AddSimpleShape() {
  auto shape = std::make_unique<SimpleShape>();
  shape->Id = ShapeIdCounter++;
  auto* shapePtr = shape.get();
  Shapes.push_back(std::move(shape));
  return shapePtr;
}